

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O1

leb_Node leb_BoundingNode(leb_Heap *leb,float x,float y)

{
  uint32_t uVar1;
  leb_Node node;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  float t;
  float fVar6;
  float local_34;
  
  uVar4 = 0;
  if ((x < 0.0) || (y < 0.0)) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    if (x + y <= 1.0) {
      uVar5 = 1;
      uVar1 = leb__HeapRead(leb,(leb_Node)0x1);
      uVar4 = 0;
      if (uVar1 != 1) {
        node.id = 1;
        node.depth = 0;
        uVar2 = 1;
        uVar5 = 0;
        local_34 = x;
        do {
          uVar3 = (uint)uVar4;
          if (leb->maxDepth == uVar3) {
            node.depth = 0;
            node.id = uVar2;
            break;
          }
          if (y <= local_34) {
            if (uVar2 != uVar3) {
              node = (leb_Node)((ulong)(uVar2 * 2) | uVar5 + 0x100000000 | 1);
            }
            fVar6 = (1.0 - local_34) - y;
          }
          else {
            if (uVar2 != uVar3) {
              node = (leb_Node)((ulong)(uVar2 * 2) | uVar5 + 0x100000000);
            }
            fVar6 = y - local_34;
            local_34 = 1.0 - local_34;
          }
          uVar4 = (ulong)node >> 0x20;
          local_34 = local_34 - y;
          uVar5 = (ulong)node & 0xffffffff00000000;
          uVar2 = node.id;
          uVar1 = leb__HeapRead(leb,node);
          y = fVar6;
        } while (uVar1 != 1);
        uVar4 = uVar4 << 0x20;
        uVar5 = (ulong)node & 0xffffffff;
      }
    }
  }
  return (leb_Node)(uVar4 | uVar5);
}

Assistant:

LEBDEF leb_Node leb_BoundingNode(const leb_Heap *leb, float x, float y)
{
    leb_Node node = {0u, 0};

    if (x >= 0.0f && y >= 0.0f && x + y <= 1.0f) {
        node = {1u, 0};

        while (!leb_IsLeafNode(leb, node) && !leb_IsCeilNode(leb, node)) {
            float s = x, t = y;

            if (s < t) {
                node = leb__LeftChildNode(node);
                x = (1.0f - s - t);
                y = (t - s);
            } else {
                node = leb__RightChildNode(node);
                x = (s - t);
                y = (1.0f - s - t);
            }
        }
    }

    return node;
}